

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O1

RK_S32 camera_source_ioctl(RK_S32 fd,RK_S32 req,void *arg)

{
  int iVar1;
  int *piVar2;
  timespec poll_time;
  timespec local_38;
  
  do {
    iVar1 = ioctl(fd,(long)req,arg);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if ((*piVar2 != 0xb) && (*piVar2 != 4)) {
        return -1;
      }
    }
    else if (iVar1 == 0) {
      return 0;
    }
    local_38.tv_sec = 0;
    local_38.tv_nsec = 10000000;
    nanosleep(&local_38,(timespec *)0x0);
  } while( true );
}

Assistant:

static RK_S32 camera_source_ioctl(RK_S32 fd, RK_S32 req, void* arg)
{
    struct timespec poll_time;
    RK_S32 ret;

    while ((ret = ioctl(fd, req, arg))) {
        if (ret == -1 && (EINTR != errno && EAGAIN != errno)) {
            // mpp_err("ret = %d, errno %d", ret, errno);
            break;
        }
        // 10 milliseconds
        poll_time.tv_sec = 0;
        poll_time.tv_nsec = 10000000;
        nanosleep(&poll_time, NULL);
    }

    return ret;
}